

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O1

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::ClientContext::PendingQueryInternal
          (ClientContext *this,ClientContextLock *lock,shared_ptr<duckdb::Relation,_true> *relation,
          bool allow_stream_result)

{
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  int iVar3;
  Relation *pRVar4;
  pointer pSVar5;
  RelationStatement *this_01;
  undefined7 in_register_00000009;
  shared_ptr<duckdb::Relation,_true> *this_02;
  templated_unique_single_t select;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_b0;
  undefined1 local_a8 [8];
  undefined8 local_a0;
  undefined1 local_98 [8];
  string query;
  _Head_base<0UL,_duckdb::RegisteredStateManager_*,_false> local_70 [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  char local_40 [16];
  
  this_02 = (shared_ptr<duckdb::Relation,_true> *)CONCAT71(in_register_00000009,allow_stream_result)
  ;
  CleanupInternal((ClientContext *)lock,(ClientContextLock *)relation,(BaseQueryResult *)0x0,false);
  LOCK();
  *(undefined1 *)&lock[4].client_guard._M_device = 0;
  UNLOCK();
  query._M_dataplus._M_p = (pointer)&query.field_2;
  query._M_string_length = 0;
  query.field_2._M_local_buf[0] = '\0';
  if (*(char *)&lock[0x1c].client_guard._M_device == '\x01') {
    pRVar4 = shared_ptr<duckdb::Relation,_true>::operator->(this_02);
    Relation::ToString_abi_cxx11_((string *)&local_50,pRVar4);
    if ((char *)local_50._M_allocated_capacity != local_40) {
      operator_delete((void *)local_50._M_allocated_capacity);
    }
    pRVar4 = shared_ptr<duckdb::Relation,_true>::operator->(this_02);
    (*pRVar4->_vptr_Relation[5])(local_70,pRVar4);
    if (local_70[0]._M_head_impl != (RegisteredStateManager *)(local_70 + 2)) {
      operator_delete(local_70[0]._M_head_impl);
    }
    pRVar4 = shared_ptr<duckdb::Relation,_true>::operator->(this_02);
    iVar3 = (*pRVar4->_vptr_Relation[8])(pRVar4);
    if ((char)iVar3 != '\0') {
      select.
      super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
      super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
      .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl =
           (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)
           operator_new(0x80);
      *(undefined1 *)
       ((long)select.
              super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
              .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl + 8) = 1;
      *(undefined8 *)
       ((long)select.
              super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
              .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl + 0x10) = 0;
      *(undefined8 *)
       ((long)select.
              super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
              .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl + 0x18) = 0;
      *(undefined8 **)
       ((long)select.
              super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
              .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl + 0x20) =
           (undefined8 *)
           ((long)select.
                  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
                  .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl + 0x50);
      *(undefined8 *)
       ((long)select.
              super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
              .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl + 0x28) = 1;
      *(undefined8 *)
       ((long)select.
              super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
              .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl + 0x30) = 0;
      *(undefined8 *)
       ((long)select.
              super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
              .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl + 0x38) = 0;
      *(undefined4 *)
       ((long)select.
              super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
              .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl + 0x40) =
           0x3f800000;
      *(undefined8 *)
       ((long)select.
              super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
              .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl + 0x48) = 0;
      *(undefined8 *)
       ((long)select.
              super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
              .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl + 0x50) = 0;
      *(undefined8 **)
       ((long)select.
              super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
              .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl + 0x58) =
           (undefined8 *)
           ((long)select.
                  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
                  .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl + 0x68);
      *(undefined8 *)
       ((long)select.
              super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
              .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl + 0x60) = 0;
      *(undefined1 *)
       ((long)select.
              super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
              .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl + 0x68) = 0;
      *(undefined ***)
       select.
       super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl =
           &PTR__SelectStatement_019b1ba8;
      *(undefined8 *)
       ((long)select.
              super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
              .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl + 0x78) = 0;
      pRVar4 = shared_ptr<duckdb::Relation,_true>::operator->(this_02);
      (*pRVar4->_vptr_Relation[3])(&local_b0,pRVar4);
      pSVar5 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
               ::operator->(&select);
      _Var2._M_head_impl = local_b0._M_head_impl;
      local_b0._M_head_impl = (QueryNode *)0x0;
      _Var1._M_head_impl =
           (pSVar5->node).
           super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
           super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (pSVar5->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
      _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var2._M_head_impl;
      if (_Var1._M_head_impl != (QueryNode *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_QueryNode + 8))();
      }
      if (local_b0._M_head_impl != (QueryNode *)0x0) {
        (*(local_b0._M_head_impl)->_vptr_QueryNode[1])();
      }
      local_a0 = (SelectStatement *)
                 select.
                 super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
                 .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
      select.
      super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
      super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
      .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl =
           (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)
           (__uniq_ptr_data<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true,_true>
            )0x0;
      RunStatementInternal
                ((ClientContext *)local_98,lock,(string *)relation,
                 (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                  *)0x0,SUB81(&local_a0,0),
                 (optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
                  )0x0,false);
      if (local_98 != (undefined1  [8])0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_98)->__weak_this_).
                    internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                  internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)();
      }
      local_98 = (undefined1  [8])0x0;
      if ((_Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
           )local_a0 != (SelectStatement *)0x0) {
        (*(local_a0->super_SQLStatement)._vptr_SQLStatement[1])();
      }
      local_a0._0_1_ = false;
      local_a0._1_7_ = 0;
      if (select.
          super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
          .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)select.
                              super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
                              .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl
                    + 8))();
      }
    }
  }
  this_01 = (RelationStatement *)operator_new(0x88);
  select.super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
  _M_t.super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl =
       (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)
       (this_02->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this_02->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  RelationStatement::RelationStatement(this_01,(shared_ptr<duckdb::Relation,_true> *)&select);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  select.super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
  _M_t.super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl =
       (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)
       (__uniq_ptr_data<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true,_true>
        )0x0;
  local_a8 = (undefined1  [8])this_01;
  PendingQueryInternal
            (this,lock,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             relation,(PendingQueryParameters *)local_a8,SUB81(&select,0));
  if (local_a8 != (undefined1  [8])0x0) {
    (*((SQLStatement *)local_a8)->_vptr_SQLStatement[1])();
  }
  local_a8 = (undefined1  [8])0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)query._M_dataplus._M_p != &query.field_2) {
    operator_delete(query._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         this;
}

Assistant:

unique_ptr<PendingQueryResult> ClientContext::PendingQueryInternal(ClientContextLock &lock,
                                                                   const shared_ptr<Relation> &relation,
                                                                   bool allow_stream_result) {
	InitialCleanup(lock);

	string query;
	if (config.query_verification_enabled) {
		// run the ToString method of any relation we run, mostly to ensure it doesn't crash
		relation->ToString();
		relation->GetAlias();
		if (relation->IsReadOnly()) {
			// verify read only statements by running a select statement
			auto select = make_uniq<SelectStatement>();
			select->node = relation->GetQueryNode();
			RunStatementInternal(lock, query, std::move(select), false, nullptr);
		}
	}

	auto relation_stmt = make_uniq<RelationStatement>(relation);
	PendingQueryParameters parameters;
	parameters.allow_stream_result = allow_stream_result;
	return PendingQueryInternal(lock, std::move(relation_stmt), parameters);
}